

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::createProgram
          (MultiVertexArrayObjectTest *this,VertexArrayState *state)

{
  float fVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  char *pcVar5;
  allocator<char> local_481;
  string local_480;
  string local_460;
  ProgramSources local_440;
  char *local_370;
  char *fragmentShader;
  float scale_3;
  float scale_2;
  float local_340;
  float local_33c;
  float scale_1;
  float scale;
  int attribNdx;
  stringstream local_328 [8];
  stringstream value;
  ostream local_318;
  stringstream local_1a0 [8];
  stringstream vertexShaderStream;
  ostream local_190;
  VertexArrayState *local_18;
  VertexArrayState *state_local;
  MultiVertexArrayObjectTest *this_local;
  
  local_18 = state;
  state_local = (VertexArrayState *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::stringstream::stringstream(local_328);
  std::operator<<(&local_190,"#version 300 es\n");
  for (scale_1 = 0.0; fVar1 = scale_1,
      sVar2 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::size(&local_18->attributes), (int)fVar1 < (int)sVar2;
      scale_1 = (float)((int)scale_1 + 1)) {
    pvVar3 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[](&local_18->attributes,(long)(int)scale_1);
    if (pvVar3->integer == '\0') {
      poVar4 = std::operator<<(&local_190,"layout(location = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)scale_1);
      poVar4 = std::operator<<(poVar4,") in mediump vec4 a_attrib");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)scale_1);
      std::operator<<(poVar4,";\n");
    }
    else {
      poVar4 = std::operator<<(&local_190,"layout(location = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)scale_1);
      poVar4 = std::operator<<(poVar4,") in mediump ivec4 a_attrib");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)scale_1);
      std::operator<<(poVar4,";\n");
    }
    pvVar3 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[](&local_18->attributes,(long)(int)scale_1);
    if (pvVar3->integer == '\0') {
      pvVar3 = std::
               vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::operator[](&local_18->attributes,(long)(int)scale_1);
      if ((pvVar3->type == 0x1406) ||
         (pvVar3 = std::
                   vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   ::operator[](&local_18->attributes,(long)(int)scale_1),
         pvVar3->normalized != '\0')) {
        pcVar5 = "";
        if (scale_1 != 0.0) {
          pcVar5 = " + ";
        }
        poVar4 = std::operator<<(&local_318,pcVar5);
        poVar4 = std::operator<<(poVar4,"a_attrib");
        std::ostream::operator<<(poVar4,(int)scale_1);
      }
      else {
        local_340 = 0.0;
        pvVar3 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&local_18->attributes,0);
        switch(pvVar3->type) {
        case 0x1400:
          local_340 = 0.007936508;
          break;
        case 0x1401:
          local_340 = 0.003937008;
          break;
        case 0x1402:
          local_340 = 3.051944e-05;
          break;
        case 0x1403:
          local_340 = 1.5259255e-05;
          break;
        case 0x1404:
          local_340 = 4.656613e-10;
          break;
        case 0x1405:
          local_340 = 2.3283064e-10;
        }
        pcVar5 = "";
        if (scale_1 != 0.0) {
          pcVar5 = " + ";
        }
        poVar4 = std::operator<<(&local_318,pcVar5);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_340);
        poVar4 = std::operator<<(poVar4," * a_attrib");
        std::ostream::operator<<(poVar4,(int)scale_1);
      }
    }
    else {
      local_33c = 0.0;
      pvVar3 = std::
               vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::operator[](&local_18->attributes,0);
      switch(pvVar3->type) {
      case 0x1400:
        local_33c = 0.015873017;
        break;
      case 0x1401:
        local_33c = 0.007874016;
        break;
      case 0x1402:
        local_33c = 6.103888e-05;
        break;
      case 0x1403:
        local_33c = 3.051851e-05;
        break;
      case 0x1404:
        local_33c = 9.313226e-10;
        break;
      case 0x1405:
        local_33c = 4.656613e-10;
      }
      pcVar5 = "";
      if (scale_1 != 0.0) {
        pcVar5 = " + ";
      }
      poVar4 = std::operator<<(&local_318,pcVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_33c);
      poVar4 = std::operator<<(poVar4," * vec4(a_attrib");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)scale_1);
      std::operator<<(poVar4,")");
    }
  }
  poVar4 = std::operator<<(&local_190,"out mediump vec4 v_value;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tv_value = ");
  std::__cxx11::stringstream::str();
  poVar4 = std::operator<<(poVar4,(string *)&scale_3);
  std::operator<<(poVar4,";\n");
  std::__cxx11::string::~string((string *)&scale_3);
  pvVar3 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[](&local_18->attributes,0);
  if (pvVar3->integer == '\0') {
    pvVar3 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[](&local_18->attributes,0);
    if ((pvVar3->normalized == '\0') &&
       (pvVar3 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&local_18->attributes,0), pvVar3->type != 0x1406)) {
      fragmentShader._0_4_ = 0.0;
      pvVar3 = std::
               vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::operator[](&local_18->attributes,0);
      switch(pvVar3->type) {
      case 0x1400:
        fragmentShader._0_4_ = 0.015873017;
        break;
      case 0x1401:
        fragmentShader._0_4_ = 0.007874016;
        break;
      case 0x1402:
        fragmentShader._0_4_ = 6.103888e-05;
        break;
      case 0x1403:
        fragmentShader._0_4_ = 3.051851e-05;
        break;
      case 0x1404:
        fragmentShader._0_4_ = 9.313226e-10;
        break;
      case 0x1405:
        fragmentShader._0_4_ = 4.656613e-10;
      }
      fragmentShader._0_4_ = fragmentShader._0_4_ * 0.5;
      poVar4 = std::operator<<(&local_190,"\tgl_Position = vec4(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,fragmentShader._0_4_);
      poVar4 = std::operator<<(poVar4," * ");
      poVar4 = std::operator<<(poVar4,"vec3(a_attrib0.xyz), 1.0);\n");
      std::operator<<(poVar4,"}");
    }
    else {
      poVar4 = std::operator<<(&local_190,"\tgl_Position = vec4(a_attrib0.xyz, 1.0);\n");
      std::operator<<(poVar4,"}");
    }
  }
  else {
    fragmentShader._4_4_ = 0.0;
    pvVar3 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[](&local_18->attributes,0);
    switch(pvVar3->type) {
    case 0x1400:
      fragmentShader._4_4_ = 0.015873017;
      break;
    case 0x1401:
      fragmentShader._4_4_ = 0.007874016;
      break;
    case 0x1402:
      fragmentShader._4_4_ = 6.103888e-05;
      break;
    case 0x1403:
      fragmentShader._4_4_ = 3.051851e-05;
      break;
    case 0x1404:
      fragmentShader._4_4_ = 9.313226e-10;
      break;
    case 0x1405:
      fragmentShader._4_4_ = 4.656613e-10;
    }
    poVar4 = std::operator<<(&local_190,"\tgl_Position = vec4(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,fragmentShader._4_4_);
    poVar4 = std::operator<<(poVar4," * ");
    poVar4 = std::operator<<(poVar4,"a_attrib0.xyz, 1.0);\n");
    std::operator<<(poVar4,"}");
  }
  local_370 = 
  "#version 300 es\nin mediump vec4 v_value;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(v_value.xyz, 1.0);\n}"
  ;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  std::__cxx11::stringstream::str();
  pcVar5 = local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,pcVar5,&local_481);
  glu::makeVtxFragSources(&local_440,&local_460,&local_480);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_440);
  glu::ProgramSources::~ProgramSources(&local_440);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::stringstream::~stringstream(local_328);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this_00;
}

Assistant:

glu::ShaderProgram* MultiVertexArrayObjectTest::createProgram (const VertexArrayState& state)
{
	std::stringstream vertexShaderStream;
	std::stringstream value;

	vertexShaderStream << "#version 300 es\n";

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		if (state.attributes[attribNdx].integer)
			vertexShaderStream << "layout(location = " << attribNdx << ") in mediump ivec4 a_attrib" << attribNdx << ";\n";
		else
			vertexShaderStream << "layout(location = " << attribNdx << ") in mediump vec4 a_attrib" << attribNdx << ";\n";

		if (state.attributes[attribNdx].integer)
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}
			value << (attribNdx != 0 ? " + " : "" ) << scale << " * vec4(a_attrib" << attribNdx << ")";
		}
		else if (state.attributes[attribNdx].type != GL_FLOAT && !state.attributes[attribNdx].normalized)
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (0.5f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (0.5f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (0.5f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (0.5f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (0.5f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (0.5f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}
			value << (attribNdx != 0 ? " + " : "" ) << scale << " * a_attrib" << attribNdx;
		}
		else
			value << (attribNdx != 0 ? " + " : "" ) << "a_attrib" << attribNdx;
	}

	vertexShaderStream
		<< "out mediump vec4 v_value;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "\tv_value = " << value.str() << ";\n";

	if (state.attributes[0].integer)
	{
		float scale = 0.0f;

		switch (state.attributes[0].type)
		{
			case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
			case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
			case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
			case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
			case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
			case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;


			default:
				DE_ASSERT(DE_FALSE);
		}

		vertexShaderStream
			<< "\tgl_Position = vec4(" << scale << " * " <<  "a_attrib0.xyz, 1.0);\n"
			<< "}";
	}
	else
	{
		if (state.attributes[0].normalized || state.attributes[0].type == GL_FLOAT)
		{
			vertexShaderStream
				<< "\tgl_Position = vec4(a_attrib0.xyz, 1.0);\n"
				<< "}";
		}
		else
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			scale *= 0.5f;

			vertexShaderStream
				<< "\tgl_Position = vec4(" << scale << " * " <<  "vec3(a_attrib0.xyz), 1.0);\n"
				<< "}";
		}
	}

	const char* fragmentShader =
	"#version 300 es\n"
	"in mediump vec4 v_value;\n"
	"layout(location = 0) out mediump vec4 fragColor;\n"
	"void main (void)\n"
	"{\n"
	"\tfragColor = vec4(v_value.xyz, 1.0);\n"
	"}";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderStream.str(), fragmentShader));
}